

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O2

void __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::parseCurrentNode
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this)

{
  unsigned_long *start;
  unsigned_long uVar1;
  bool bVar2;
  long lVar3;
  unsigned_long *end;
  
  start = this->P;
  lVar3 = 0;
  end = start;
  while( true ) {
    if (*end == 0) {
      return;
    }
    if (*end == 0x3c) break;
    end = end + 1;
    this->P = end;
    lVar3 = lVar3 + 8;
  }
  if (0 < lVar3) {
    bVar2 = setText(this,start,end);
    if (bVar2) {
      return;
    }
    end = this->P;
  }
  this->P = end + 1;
  uVar1 = end[1];
  if (uVar1 == 0x21) {
    bVar2 = parseCDATA(this);
    if (bVar2) {
      return;
    }
    parseComment(this);
    return;
  }
  if (uVar1 == 0x3f) {
    ignoreDefinition(this);
    return;
  }
  if (uVar1 != 0x2f) {
    parseOpeningXMLElement(this);
    return;
  }
  parseClosingXMLElement(this);
  return;
}

Assistant:

void parseCurrentNode()
	{
		char_type* start = P;

		// move forward until '<' found
		while(*P != L'<' && *P)
			++P;

		if (!*P)
			return;

		if (P - start > 0)
		{
			// we found some text, store it
			if (setText(start, P))
				return;
		}

		++P;

		// based on current token, parse and report next element
		switch(*P)
		{
		case L'/':
			parseClosingXMLElement(); 
			break;
		case L'?':
			ignoreDefinition();	
			break;
		case L'!':
			if (!parseCDATA())
				parseComment();	
			break;
		default:
			parseOpeningXMLElement();
			break;
		}
	}